

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyUriEncode(char *zSrc,sxu32 nLen,ProcConsumer xConsumer,void *pUserData)

{
  uint uVar1;
  sxi32 sVar2;
  ushort **ppuVar3;
  int local_50;
  sxi32 rc;
  sxi32 c;
  uchar *zEnd;
  uchar *zCur;
  uchar zOut [2];
  uchar *puStack_30;
  uchar zHex [3];
  uchar *zIn;
  void *pUserData_local;
  ProcConsumer xConsumer_local;
  sxu32 nLen_local;
  char *zSrc_local;
  
  zCur._5_2_ = 0x25;
  zCur._7_1_ = '\0';
  local_50 = 0;
  zEnd = (uchar *)zSrc;
  puStack_30 = (uchar *)zSrc;
  while (zEnd < zSrc + nLen) {
    uVar1 = (uint)*zEnd;
    ppuVar3 = __ctype_b_loc();
    if ((((((*ppuVar3)[(int)uVar1] & 8) == 0) && (uVar1 != 0x5f)) && (uVar1 != 0x2d)) &&
       ((uVar1 != 0x24 && (uVar1 != 0x2e)))) {
      if ((zEnd != puStack_30) &&
         (local_50 = (*xConsumer)(puStack_30,(int)zEnd - (int)puStack_30,pUserData), local_50 != 0))
      goto LAB_001544dd;
      if (uVar1 == 0x20) {
        zCur._3_1_ = 0x2b;
        local_50 = (*xConsumer)((void *)((long)&zCur + 3),1,pUserData);
      }
      else {
        zCur._5_2_ = CONCAT11("0123456789ABCDEF"[(int)uVar1 >> 4],zCur._5_1_);
        zCur._7_1_ = "0123456789ABCDEF"[(int)(uVar1 & 0xf)];
        local_50 = (*xConsumer)((void *)((long)&zCur + 5),3,pUserData);
      }
      if (local_50 != 0) goto LAB_001544dd;
      zEnd = zEnd + 1;
      puStack_30 = zEnd;
    }
    else {
      zEnd = zEnd + 1;
    }
  }
  if (zEnd != puStack_30) {
    local_50 = (*xConsumer)(puStack_30,(int)zEnd - (int)puStack_30,pUserData);
  }
LAB_001544dd:
  sVar2 = -10;
  if (local_50 == 0) {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

JX9_PRIVATE sxi32 SyUriEncode(const char *zSrc, sxu32 nLen, ProcConsumer xConsumer, void *pUserData)
{
	unsigned char *zIn = (unsigned char *)zSrc;
	unsigned char zHex[3] = { '%', 0, 0 };
	unsigned char zOut[2];
	unsigned char *zCur, *zEnd;
	sxi32 c;
	sxi32 rc;
#ifdef UNTRUST
	if( SX_EMPTY_STR(zSrc) || xConsumer == 0 ){
		return SXERR_EMPTY;
	}
#endif
	rc = SXRET_OK;
	zEnd = &zIn[nLen]; zCur = zIn;
	for(;;){
		if( zCur >= zEnd ){
			if( zCur != zIn ){
				rc = xConsumer(zIn, (sxu32)(zCur-zIn), pUserData);
			}
			break;
		}
		c = zCur[0];
		if( SAFE_HTTP(c) ){
			zCur++; continue;
		}
		if( zCur != zIn && SXRET_OK != (rc = xConsumer(zIn, (sxu32)(zCur-zIn), pUserData))){
			break;
		}		
		if( c == ' ' ){
			zOut[0] = '+';
			rc = xConsumer((const void *)zOut, sizeof(unsigned char), pUserData);
		}else{
			zHex[1]	= "0123456789ABCDEF"[(c >> 4) & 0x0F];
			zHex[2] = "0123456789ABCDEF"[c & 0x0F];
			rc = xConsumer(zHex, sizeof(zHex), pUserData);
		}
		if( SXRET_OK != rc ){
			break;
		}				
		zIn = &zCur[1]; zCur = zIn ;
	}
	return rc == SXRET_OK ? SXRET_OK : SXERR_ABORT;
}